

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Type_Function.cpp
# Opt level: O3

ostream * psy::C::operator<<(ostream *os,FunctionType *funcTy)

{
  long lVar1;
  char *pcVar2;
  Type **paramTy;
  pointer ppTVar3;
  vector<const_psy::C::Type_*,_std::allocator<const_psy::C::Type_*>_> local_38;
  
  if (funcTy == (FunctionType *)0x0) {
    pcVar2 = "<FunctionType is null>";
    lVar1 = 0x16;
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>(os,"<FunctionType | ",0x10);
    std::__ostream_insert<char,std::char_traits<char>>(os," return-type:",0xd);
    operator<<(os,*(Type **)((funcTy->super_Type).impl_._M_t.
                             super___uniq_ptr_impl<psy::C::Type::TypeImpl,_std::default_delete<psy::C::Type::TypeImpl>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_psy::C::Type::TypeImpl_*,_std::default_delete<psy::C::Type::TypeImpl>_>
                             .super__Head_base<0UL,_psy::C::Type::TypeImpl_*,_false>._M_head_impl +
                            2));
    std::vector<const_psy::C::Type_*,_std::allocator<const_psy::C::Type_*>_>::vector
              (&local_38,
               (vector<const_psy::C::Type_*,_std::allocator<const_psy::C::Type_*>_> *)
               ((funcTy->super_Type).impl_._M_t.
                super___uniq_ptr_impl<psy::C::Type::TypeImpl,_std::default_delete<psy::C::Type::TypeImpl>_>
                ._M_t.
                super__Tuple_impl<0UL,_psy::C::Type::TypeImpl_*,_std::default_delete<psy::C::Type::TypeImpl>_>
                .super__Head_base<0UL,_psy::C::Type::TypeImpl_*,_false>._M_head_impl + 4));
    for (ppTVar3 = local_38.
                   super__Vector_base<const_psy::C::Type_*,_std::allocator<const_psy::C::Type_*>_>.
                   _M_impl.super__Vector_impl_data._M_start;
        ppTVar3 !=
        local_38.super__Vector_base<const_psy::C::Type_*,_std::allocator<const_psy::C::Type_*>_>.
        _M_impl.super__Vector_impl_data._M_finish; ppTVar3 = ppTVar3 + 1) {
      std::__ostream_insert<char,std::char_traits<char>>(os," parameter-type:",0x10);
      operator<<(os,*ppTVar3);
    }
    if (local_38.super__Vector_base<const_psy::C::Type_*,_std::allocator<const_psy::C::Type_*>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_38.
                      super__Vector_base<const_psy::C::Type_*,_std::allocator<const_psy::C::Type_*>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_38.
                            super__Vector_base<const_psy::C::Type_*,_std::allocator<const_psy::C::Type_*>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_38.
                            super__Vector_base<const_psy::C::Type_*,_std::allocator<const_psy::C::Type_*>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    pcVar2 = ">";
    lVar1 = 1;
  }
  std::__ostream_insert<char,std::char_traits<char>>(os,pcVar2,lVar1);
  return os;
}

Assistant:

PSY_C_API std::ostream& operator<<(std::ostream& os, const FunctionType* funcTy)
{
    if (!funcTy)
        return os << "<FunctionType is null>";
    os << "<FunctionType | ";
    os << " return-type:" << funcTy->returnType();
    for (const auto& paramTy : funcTy->parameterTypes()) {
        os << " parameter-type:";
        os << paramTy;
    }
    os << ">";
    return os;
}